

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeCost
          (CostAttributes *this,MatrixDynSize *inputSelector)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint rangeSize;
  uint totalDimension;
  undefined1 local_29;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::MatrixSelector,std::allocator<iDynTree::optimalcontrol::MatrixSelector>,iDynTree::MatrixDynSize_const&>
            (&_Stack_20,(MatrixSelector **)&local_28,
             (allocator<iDynTree::optimalcontrol::MatrixSelector> *)&local_29,inputSelector);
  _Var2._M_pi = _Stack_20._M_pi;
  peVar1 = local_28;
  local_28 = (element_type *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->selector).
            super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->selector).
  super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  (this->selector).
  super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  rangeSize = iDynTree::MatrixDynSize::rows();
  totalDimension = iDynTree::MatrixDynSize::cols();
  initializeBuffers(this,rangeSize,totalDimension);
  return;
}

Assistant:

void initializeCost(const MatrixDynSize& inputSelector) {
                this->selector = std::make_shared<MatrixSelector>(inputSelector);
                unsigned int rangeSize = inputSelector.rows();
                unsigned int totalDimension = inputSelector.cols();
                initializeBuffers(rangeSize, totalDimension);
            }